

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

bool __thiscall miniros::NodeHandle::hasParam(NodeHandle *this,string *key)

{
  bool bVar1;
  undefined1 local_48 [16];
  string local_38;
  
  getMasterLink((NodeHandle *)local_48);
  resolveName(&local_38,this,key,true);
  bVar1 = MasterLink::has((MasterLink *)local_48._0_8_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return bVar1;
}

Assistant:

bool NodeHandle::hasParam(const std::string& key) const
{
  return getMasterLink()->has(resolveName(key));
}